

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O0

void monster_list_collect(monster_list_t *list)

{
  loc_conflict grid1;
  _Bool _Var1;
  wchar_t wVar2;
  uint uVar3;
  monster *mon_00;
  int iStack_2c;
  _Bool los;
  wchar_t field;
  wchar_t j;
  monster_list_entry_t *entry;
  monster *mon;
  wchar_t i;
  monster_list_t *list_local;
  
  if (((list != (monster_list_t *)0x0) && (list->entries != (monster_list_entry_t *)0x0)) &&
     (_Var1 = monster_list_can_update(list), _Var1)) {
    for (mon._4_4_ = L'\x01'; wVar2 = cave_monster_max(cave), mon._4_4_ < wVar2;
        mon._4_4_ = mon._4_4_ + L'\x01') {
      mon_00 = (monster *)cave_monster(cave,mon._4_4_);
      _field = (monster_list_entry_t *)0x0;
      _Var1 = monster_is_visible(mon_00);
      if ((_Var1) && (_Var1 = monster_is_camouflaged(mon_00), !_Var1)) {
        for (iStack_2c = 0; iStack_2c < (int)list->entries_size; iStack_2c = iStack_2c + 1) {
          if (list->entries[iStack_2c].race == (monster_race *)0x0) {
            _field = list->entries + iStack_2c;
            memset(_field,0,0x20);
            _field->race = mon_00->race;
            break;
          }
          if (list->entries[iStack_2c].race == mon_00->race) {
            _field = list->entries + iStack_2c;
            break;
          }
        }
        if (_field != (monster_list_entry_t *)0x0) {
          _field->attr = mon_00->attr;
          grid1.x = (player->grid).x;
          grid1.y = (player->grid).y;
          _Var1 = projectable((chunk *)cave,grid1,mon_00->grid,L'\0');
          uVar3 = (uint)!_Var1;
          _field->count[(int)uVar3] = _field->count[(int)uVar3] + 1;
          if (0 < mon_00->m_timed[0]) {
            _field->asleep[(int)uVar3] = _field->asleep[(int)uVar3] + 1;
          }
          _field->dx[(int)uVar3] = (short)(mon_00->grid).x - (short)(player->grid).x;
          _field->dy[(int)uVar3] = (short)(mon_00->grid).y - (short)(player->grid).y;
        }
      }
    }
    for (mon._4_4_ = 0; mon._4_4_ < (int)list->entries_size; mon._4_4_ = mon._4_4_ + 1) {
      if (list->entries[mon._4_4_].race != (monster_race *)0x0) {
        if (list->entries[mon._4_4_].count[0] != 0) {
          list->total_entries[0] = list->total_entries[0] + 1;
        }
        if (list->entries[mon._4_4_].count[1] != 0) {
          list->total_entries[1] = list->total_entries[1] + 1;
        }
        list->total_monsters[0] = list->total_monsters[0] + list->entries[mon._4_4_].count[0];
        list->total_monsters[1] = list->total_monsters[1] + list->entries[mon._4_4_].count[1];
        list->distinct_entries = list->distinct_entries + 1;
      }
    }
    list->creation_turn = turn;
    list->sorted = false;
  }
  return;
}

Assistant:

void monster_list_collect(monster_list_t *list)
{
	int i;

	if (list == NULL || list->entries == NULL)
		return;

	if (!monster_list_can_update(list))
		return;

	/* Use cave_monster_max() here in case the monster list isn't compacted. */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);
		monster_list_entry_t *entry = NULL;
		int j, field;
		bool los = false;

		/* Only consider visible, known monsters */
		if (!monster_is_visible(mon) ||	monster_is_camouflaged(mon))
			continue;

		/* Find or add a list entry. */
		for (j = 0; j < (int)list->entries_size; j++) {
			if (list->entries[j].race == NULL) {
				/* We found an empty slot, so add this race here. */
				entry = &list->entries[j];
				memset(entry, 0, sizeof(monster_list_entry_t));
				entry->race = mon->race;
				break;
			}
			else if (list->entries[j].race == mon->race) {
				/* We found a matching race and we'll use that. */
				entry = &list->entries[j];
				break;
			}
		}

		if (entry == NULL)
			continue;

		/* Always collect the latest monster attribute so that flicker
		 * animation works. If this is 0, it needs to be replaced by 
		 * the standard glyph in the UI */
		entry->attr = mon->attr;

		/*
		 * Check for LOS
		 * Hack - we should use (mon->mflag & (MFLAG_VIEW)) here,
		 * but this does not catch monsters detected by ESP which are
		 * targetable, so we cheat and use projectable() instead
		 */
		los = projectable(cave, player->grid, mon->grid, PROJECT_NONE);
		field = (los) ? MONSTER_LIST_SECTION_LOS : MONSTER_LIST_SECTION_ESP;
		entry->count[field]++;

		if (mon->m_timed[MON_TMD_SLEEP] > 0)
			entry->asleep[field]++;

		/* Store the location offset from the player; this is only used for
		 * monster counts of 1 */
		entry->dx[field] = mon->grid.x - player->grid.x;
		entry->dy[field] = mon->grid.y - player->grid.y;
	}

	/* Collect totals for easier calculations of the list. */
	for (i = 0; i < (int)list->entries_size; i++) {
		if (list->entries[i].race == NULL)
			continue;

		if (list->entries[i].count[MONSTER_LIST_SECTION_LOS] > 0)
			list->total_entries[MONSTER_LIST_SECTION_LOS]++;

		if (list->entries[i].count[MONSTER_LIST_SECTION_ESP] > 0)
			list->total_entries[MONSTER_LIST_SECTION_ESP]++;

		list->total_monsters[MONSTER_LIST_SECTION_LOS] +=
			list->entries[i].count[MONSTER_LIST_SECTION_LOS];
		list->total_monsters[MONSTER_LIST_SECTION_ESP] +=
			list->entries[i].count[MONSTER_LIST_SECTION_ESP];
		list->distinct_entries++;
	}

	list->creation_turn = turn;
	list->sorted = false;
}